

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  short sVar13;
  uint uVar14;
  
  if ((j->code_bits < 0x10) && (stbi__grow_buffer_unsafe(j), j->code_bits < 0x10)) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar14 = j->code_buffer;
  uVar8 = (ulong)hdc->fast[uVar14 >> 0x17];
  if (uVar8 == 0xff) {
    lVar11 = 0;
    do {
      lVar12 = lVar11;
      lVar11 = lVar12 + 1;
    } while (hdc->maxcode[lVar12 + 10] <= uVar14 >> 0x10);
    iVar6 = j->code_bits;
    if (lVar11 == 8) {
LAB_001160a8:
      j->code_bits = iVar6 + -0x10;
    }
    else if ((int)(lVar12 + 10) <= iVar6) {
      uVar3 = stbi__bmask[lVar12 + 10];
      iVar9 = hdc->delta[lVar12 + 10];
      j->code_bits = (iVar6 - (int)lVar11) + -9;
      j->code_buffer = uVar14 << ((byte)(lVar12 + 10) & 0x1f);
      uVar8 = (ulong)(int)((uVar14 >> (0x17U - (char)lVar11 & 0x1f) & uVar3) + iVar9);
      goto LAB_00116107;
    }
  }
  else {
    bVar1 = hdc->size[uVar8];
    if ((int)(uint)bVar1 <= j->code_bits) {
      j->code_buffer = uVar14 << (bVar1 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar1;
LAB_00116107:
      bVar1 = hdc->values[uVar8];
      data[0x38] = 0;
      data[0x39] = 0;
      data[0x3a] = 0;
      data[0x3b] = 0;
      data[0x3c] = 0;
      data[0x3d] = 0;
      data[0x3e] = 0;
      data[0x3f] = 0;
      data[0x30] = 0;
      data[0x31] = 0;
      data[0x32] = 0;
      data[0x33] = 0;
      data[0x34] = 0;
      data[0x35] = 0;
      data[0x36] = 0;
      data[0x37] = 0;
      data[0x28] = 0;
      data[0x29] = 0;
      data[0x2a] = 0;
      data[0x2b] = 0;
      data[0x2c] = 0;
      data[0x2d] = 0;
      data[0x2e] = 0;
      data[0x2f] = 0;
      data[0x20] = 0;
      data[0x21] = 0;
      data[0x22] = 0;
      data[0x23] = 0;
      data[0x24] = 0;
      data[0x25] = 0;
      data[0x26] = 0;
      data[0x27] = 0;
      data[0x18] = 0;
      data[0x19] = 0;
      data[0x1a] = 0;
      data[0x1b] = 0;
      data[0x1c] = 0;
      data[0x1d] = 0;
      data[0x1e] = 0;
      data[0x1f] = 0;
      data[0x10] = 0;
      data[0x11] = 0;
      data[0x12] = 0;
      data[0x13] = 0;
      data[0x14] = 0;
      data[0x15] = 0;
      data[0x16] = 0;
      data[0x17] = 0;
      data[8] = 0;
      data[9] = 0;
      data[10] = 0;
      data[0xb] = 0;
      data[0xc] = 0;
      data[0xd] = 0;
      data[0xe] = 0;
      data[0xf] = 0;
      data[0] = 0;
      data[1] = 0;
      data[2] = 0;
      data[3] = 0;
      data[4] = 0;
      data[5] = 0;
      data[6] = 0;
      data[7] = 0;
      iVar9 = j->code_bits;
      if (bVar1 == 0) {
        iVar6 = 0;
      }
      else {
        if (iVar9 < (int)(uint)bVar1) {
          stbi__grow_buffer_unsafe(j);
          iVar9 = j->code_bits;
        }
        uVar14 = j->code_buffer;
        uVar5 = uVar14 << (bVar1 & 0x1f) | uVar14 >> 0x20 - (bVar1 & 0x1f);
        uVar3 = *(uint *)((long)stbi__bmask + (ulong)((uint)bVar1 * 4));
        j->code_buffer = ~uVar3 & uVar5;
        iVar9 = iVar9 - (uint)bVar1;
        j->code_bits = iVar9;
        iVar6 = 0;
        if (-1 < (int)uVar14) {
          iVar6 = *(int *)((long)stbi__jbias + (ulong)((uint)bVar1 * 4));
        }
        iVar6 = iVar6 + (uVar3 & uVar5);
      }
      iVar6 = iVar6 + j->img_comp[b].dc_pred;
      j->img_comp[b].dc_pred = iVar6;
      *data = (short)iVar6 * *dequant;
      iVar10 = 1;
      do {
        if (iVar9 < 0x10) {
          stbi__grow_buffer_unsafe(j);
        }
        uVar14 = j->code_buffer;
        uVar8 = (ulong)(uVar14 >> 0x17);
        uVar2 = fac[uVar8];
        if (uVar2 == 0) {
          if (j->code_bits < 0x10) {
            stbi__grow_buffer_unsafe(j);
            uVar14 = j->code_buffer;
            uVar8 = (ulong)(uVar14 >> 0x17);
          }
          uVar8 = (ulong)hac->fast[uVar8];
          if (uVar8 == 0xff) {
            lVar11 = 0;
            do {
              lVar12 = lVar11;
              lVar11 = lVar12 + 1;
            } while (hac->maxcode[lVar12 + 10] <= uVar14 >> 0x10);
            iVar6 = j->code_bits;
            if (lVar11 == 8) goto LAB_001160a8;
            if (iVar6 < (int)(lVar12 + 10)) break;
            uVar3 = stbi__bmask[lVar12 + 10];
            iVar4 = hac->delta[lVar12 + 10];
            uVar5 = uVar14 << ((byte)(lVar12 + 10) & 0x1f);
            iVar9 = (iVar6 - (int)lVar11) + -9;
            j->code_bits = (iVar6 - (int)lVar11) + -9;
            j->code_buffer = uVar5;
            uVar8 = (ulong)(int)((uVar14 >> (0x17U - (char)lVar11 & 0x1f) & uVar3) + iVar4);
          }
          else {
            bVar1 = hac->size[uVar8];
            iVar9 = j->code_bits - (uint)bVar1;
            if (j->code_bits < (int)(uint)bVar1) break;
            uVar5 = uVar14 << (bVar1 & 0x1f);
            j->code_buffer = uVar5;
            j->code_bits = iVar9;
          }
          bVar1 = hac->values[uVar8];
          uVar14 = bVar1 & 0xf;
          if ((bVar1 & 0xf) == 0) {
            if (bVar1 != 0xf0) {
              return 1;
            }
            iVar10 = iVar10 + 0x10;
          }
          else {
            lVar11 = (long)iVar10 + (ulong)(bVar1 >> 4);
            bVar1 = ""[lVar11];
            if (iVar9 < (int)uVar14) {
              stbi__grow_buffer_unsafe(j);
              uVar5 = j->code_buffer;
              iVar9 = j->code_bits;
            }
            uVar7 = uVar5 << (sbyte)uVar14 | uVar5 >> 0x20 - (sbyte)uVar14;
            uVar3 = *(uint *)((long)stbi__bmask + (ulong)(uVar14 << 2));
            j->code_buffer = ~uVar3 & uVar7;
            iVar9 = iVar9 - uVar14;
            j->code_bits = iVar9;
            sVar13 = 0;
            if (-1 < (int)uVar5) {
              sVar13 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar14 << 2));
            }
            iVar10 = (int)lVar11 + 1;
            *(ushort *)((long)data + (ulong)((uint)bVar1 * 2)) =
                 (((ushort)uVar7 & (ushort)uVar3) + sVar13) *
                 *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
          }
        }
        else {
          lVar11 = (long)iVar10 + (ulong)(uVar2 >> 4 & 0xf);
          j->code_buffer = uVar14 << (sbyte)(uVar2 & 0xf);
          iVar9 = j->code_bits - (uVar2 & 0xf);
          j->code_bits = iVar9;
          iVar10 = (int)lVar11 + 1;
          *(short *)((long)data + (ulong)((uint)""[lVar11] * 2)) =
               (short)(char)(uVar2 >> 8) * *(short *)((long)dequant + (ulong)((uint)""[lVar11] * 2))
          ;
        }
        if (0x3f < iVar10) {
          return 1;
        }
      } while( true );
    }
  }
  stbi__g_failure_reason = "bad huffman code";
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}